

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

ssize_t ExprEval::Operator::BaseSpecification::read(int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  bool bVar2;
  Exception *this;
  istream *piVar3;
  char *__nptr;
  size_type sVar4;
  reference this_00;
  ssize_t sVar5;
  undefined4 in_register_0000003c;
  byte local_479;
  string local_478 [7];
  uchar count;
  string expression;
  undefined1 local_458 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  string symbol;
  long local_420;
  stringstream stream;
  ostream local_410 [376];
  string local_298 [8];
  string token;
  string local_278 [8];
  string line;
  allocator local_251;
  string local_250 [48];
  long local_220;
  ifstream file;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *table;
  string *file_path_local;
  
  std::ifstream::ifstream(&local_220,CONCAT44(in_register_0000003c,__fd),8);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_278);
    std::__cxx11::string::string(local_298);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_420);
    std::__cxx11::string::string
              ((string *)
               &variables.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_458);
    std::__cxx11::string::string(local_478);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_220,local_278);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      local_479 = 0;
      std::ios::clear((long)&local_420 + *(long *)(local_420 + -0x18),0);
      std::operator<<(local_410,local_278);
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&local_420,local_298,',');
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
        if (!bVar2) break;
        local_479 = local_479 + 1;
        if (local_479 == 1) {
          std::__cxx11::string::operator=
                    ((string *)
                     &variables.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_298);
        }
        else if (local_479 == 2) {
          __nptr = (char *)std::__cxx11::string::c_str();
          sVar4 = atol(__nptr);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_458,sVar4);
        }
        else if ((local_479 < 3) ||
                (sVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_458), sVar4 + 2 < (ulong)local_479)) {
          std::__cxx11::string::operator=(local_478,local_298);
        }
        else {
          this_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_458,(long)(int)(local_479 - 3));
          std::__cxx11::string::operator=((string *)this_00,local_298);
        }
      }
      add_custom_operator((string *)
                          &variables.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_458,(string *)local_478);
    }
    std::ifstream::close();
    std::__cxx11::string::~string(local_478);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_458);
    std::__cxx11::string::~string
              ((string *)
               &variables.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_420);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_278);
    sVar5 = std::ifstream::~ifstream(&local_220);
    return sVar5;
  }
  this = (Exception *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"Cannot open the specification file!",&local_251);
  Engine::Exception::Exception(this,File,(string *)local_250);
  __cxa_throw(this,&Engine::Exception::typeinfo,Engine::Exception::~Exception);
}

Assistant:

void BaseSpecification::read(const std::string& file_path){
            auto table = custom_operator_table;
            std::ifstream file(file_path);

            if(!file){
                throw Engine::Exception(Engine::Error::File, "Cannot open the specification file!");
            }

            std::string line;
            std::string token;
            std::stringstream stream;
            std::string symbol;
            std::vector<std::string> variables;
            std::string expression;
            while(std::getline(file, line)){
                unsigned char count = 0;
                stream.clear();
                stream << line;
                while(std::getline(stream, token, ',')){
                    ++count;
                    if(count == 1){
                        symbol = token;
                    }
                    else if(count == 2){
                        variables.resize(atol(token.c_str()));
                    }
                    else if(count > 2 && count <= variables.size() + 2){
                        variables[count-3] = token;
                    }
                    else{
                        expression = token;
                    }
                }
                add_custom_operator(symbol, variables, expression);
            }

            file.close();
        }